

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biptlist.cpp
# Opt level: O0

EDist __thiscall BiPtList::xHeightToEnds(BiPtList *this,Pt2i *pt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  const_reference pvVar7;
  Pt2i *in_RDX;
  int local_50;
  int local_4c;
  int cy;
  int cx;
  int by;
  int bx;
  int ay;
  int ax;
  int p2y;
  int p2x;
  int p1y;
  int p1x;
  int yp;
  int xp;
  Pt2i *pt_local;
  BiPtList *this_local;
  
  iVar1 = Pt2i::x(in_RDX);
  iVar2 = Pt2i::y(in_RDX);
  pvVar7 = std::deque<Pt2i,_std::allocator<Pt2i>_>::front((deque<Pt2i,_std::allocator<Pt2i>_> *)pt);
  iVar3 = Pt2i::x(pvVar7);
  pvVar7 = std::deque<Pt2i,_std::allocator<Pt2i>_>::front((deque<Pt2i,_std::allocator<Pt2i>_> *)pt);
  iVar4 = Pt2i::y(pvVar7);
  pvVar7 = std::deque<Pt2i,_std::allocator<Pt2i>_>::back((deque<Pt2i,_std::allocator<Pt2i>_> *)pt);
  iVar5 = Pt2i::x(pvVar7);
  pvVar7 = std::deque<Pt2i,_std::allocator<Pt2i>_>::back((deque<Pt2i,_std::allocator<Pt2i>_> *)pt);
  iVar6 = Pt2i::y(pvVar7);
  cy = iVar2;
  cx = iVar1;
  if (iVar1 < iVar3) {
    local_50 = iVar4;
    local_4c = iVar3;
    by = iVar6;
    bx = iVar5;
    if ((iVar1 < iVar5) && (cy = iVar6, cx = iVar5, by = iVar2, bx = iVar1, iVar3 < iVar5)) {
      local_50 = iVar6;
      local_4c = iVar5;
      cy = iVar4;
      cx = iVar3;
    }
  }
  else {
    local_50 = iVar6;
    local_4c = iVar5;
    by = iVar4;
    bx = iVar3;
    if ((iVar5 <= iVar1) &&
       (local_50 = iVar2, local_4c = iVar1, cy = iVar4, cx = iVar3, by = iVar6, bx = iVar5,
       iVar3 < iVar5)) {
      cy = iVar6;
      cx = iVar5;
      by = iVar4;
      bx = iVar3;
    }
  }
  EDist::EDist((EDist *)this,(cx - bx) * (local_50 - by) - (cy - by) * (local_4c - bx),local_4c - bx
              );
  return (EDist)this;
}

Assistant:

EDist BiPtList::xHeightToEnds (const Pt2i &pt) const
{
  int xp = pt.x (), yp = pt.y ();
  int p1x = pts.front().x (), p1y = pts.front().y ();
  int p2x = pts.back().x (), p2y = pts.back().y ();
  int ax, ay, bx, by, cx, cy;

  if (xp < p1x)
  {
    if (xp < p2x)
    {
      ax = xp;
      ay = yp;
      if (p1x < p2x)
      {
        bx = p1x;
        by = p1y;
        cx = p2x;
        cy = p2y;
      }
      else
      {
        bx = p2x;
        by = p2y;
        cx = p1x;
        cy = p1y;
      }
    }
    else
    {
      ax = p2x;
      ay = p2y;
      bx = xp;
      by = yp;
      cx = p1x;
      cy = p1y;
    }
  }
  else
  { 
    if (xp < p2x) 
    { 
      ax = p1x; 
      ay = p1y; 
      bx = xp; 
      by = yp; 
      cx = p2x; 
      cy = p2y; 
    } 
    else
    { 
      cx = xp; 
      cy = yp; 
      if (p1x < p2x) 
      { 
        ax = p1x; 
        ay = p1y; 
        bx = p2x; 
        by = p2y; 
      } 
      else 
      { 
        ax = p2x; 
        ay = p2y; 
        bx = p1x; 
        by = p1y; 
      } 
    } 
  } 
  return (EDist ((bx - ax) * (cy - ay) - (by - ay) * (cx - ax), cx - ax));
}